

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::ConfigDeclarationSyntax::ConfigDeclarationSyntax
          (ConfigDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token config,Token name,
          Token semi1,SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *localparams,
          Token design,SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *topCells,Token semi2,
          SyntaxList<slang::syntax::ConfigRuleSyntax> *rules,Token endconfig,
          NamedBlockClauseSyntax *blockName)

{
  size_t sVar1;
  pointer ppAVar2;
  pointer ppPVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  SyntaxNode *pSVar6;
  undefined4 uVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  
  uVar10 = name._0_8_;
  uVar9 = config._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = ConfigDeclaration;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar7 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar6 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar7;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar6;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005dac60;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar8 = 0;
    do {
      *(ConfigDeclarationSyntax **)(*(long *)((long)ppAVar2 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  (this->config).kind = (short)uVar9;
  (this->config).field_0x2 = (char)((ulong)uVar9 >> 0x10);
  (this->config).numFlags = (NumericTokenFlags)(char)((ulong)uVar9 >> 0x18);
  (this->config).rawLen = (int)((ulong)uVar9 >> 0x20);
  (this->config).info = config.info;
  (this->name).kind = (short)uVar10;
  (this->name).field_0x2 = (char)((ulong)uVar10 >> 0x10);
  (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar10 >> 0x18);
  (this->name).rawLen = (int)((ulong)uVar10 >> 0x20);
  (this->name).info = name.info;
  (this->semi1).kind = semi1.kind;
  (this->semi1).field_0x2 = semi1._2_1_;
  (this->semi1).numFlags = (NumericTokenFlags)semi1.numFlags.raw;
  (this->semi1).rawLen = semi1.rawLen;
  (this->semi1).info = semi1.info;
  uVar7 = *(undefined4 *)&(localparams->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar6 = (localparams->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.kind =
       (localparams->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->localparams).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar7;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.parent = pSVar6;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (localparams->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->localparams).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (this->localparams).super_SyntaxListBase.childCount =
       (localparams->super_SyntaxListBase).childCount;
  sVar1 = (localparams->
          super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (this->localparams).
  super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>._M_ptr =
       (localparams->
       super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->localparams).
  super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>._M_extent
  ._M_extent_value = sVar1;
  (this->localparams).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005db398;
  (this->design).kind = design.kind;
  (this->design).field_0x2 = design._2_1_;
  (this->design).numFlags = (NumericTokenFlags)design.numFlags.raw;
  (this->design).rawLen = design.rawLen;
  (this->design).info = design.info;
  uVar7 = *(undefined4 *)&(topCells->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar6 = (topCells->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.kind =
       (topCells->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->topCells).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar7;
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.parent = pSVar6;
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (topCells->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->topCells).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (this->topCells).super_SyntaxListBase.childCount = (topCells->super_SyntaxListBase).childCount;
  sVar1 = (topCells->super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>
          )._M_extent._M_extent_value;
  (this->topCells).super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>.
  _M_ptr = (topCells->
           super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->topCells).super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar1;
  (this->topCells).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005db420;
  (this->semi2).kind = semi2.kind;
  (this->semi2).field_0x2 = semi2._2_1_;
  (this->semi2).numFlags = (NumericTokenFlags)semi2.numFlags.raw;
  (this->semi2).rawLen = semi2.rawLen;
  (this->semi2).info = semi2.info;
  uVar7 = *(undefined4 *)&(rules->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar6 = (rules->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.kind =
       (rules->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->rules).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar7;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.parent = pSVar6;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (rules->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->rules).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (this->rules).super_SyntaxListBase.childCount = (rules->super_SyntaxListBase).childCount;
  sVar1 = (rules->super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>._M_ptr =
       (rules->super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->rules).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005db4a8;
  (this->endconfig).kind = endconfig.kind;
  (this->endconfig).field_0x2 = endconfig._2_1_;
  (this->endconfig).numFlags = (NumericTokenFlags)endconfig.numFlags.raw;
  (this->endconfig).rawLen = endconfig.rawLen;
  (this->endconfig).info = endconfig.info;
  this->blockName = blockName;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->localparams).
          super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppPVar3 = (this->localparams).
              super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>
              ._M_ptr;
    lVar8 = 0;
    do {
      *(ConfigDeclarationSyntax **)(*(long *)((long)ppPVar3 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->topCells).
          super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppCVar4 = (this->topCells).
              super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>._M_ptr
    ;
    lVar8 = 0;
    do {
      *(ConfigDeclarationSyntax **)(*(long *)((long)ppCVar4 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  (this->rules).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppCVar5 = (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar8 = 0;
    do {
      *(ConfigDeclarationSyntax **)(*(long *)((long)ppCVar5 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  if (blockName != (NamedBlockClauseSyntax *)0x0) {
    (blockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ConfigDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token config, Token name, Token semi1, const SyntaxList<ParameterDeclarationStatementSyntax>& localparams, Token design, const SyntaxList<ConfigCellIdentifierSyntax>& topCells, Token semi2, const SyntaxList<ConfigRuleSyntax>& rules, Token endconfig, NamedBlockClauseSyntax* blockName) :
        MemberSyntax(SyntaxKind::ConfigDeclaration, attributes), config(config), name(name), semi1(semi1), localparams(localparams), design(design), topCells(topCells), semi2(semi2), rules(rules), endconfig(endconfig), blockName(blockName) {
        this->localparams.parent = this;
        for (auto child : this->localparams)
            child->parent = this;
        this->topCells.parent = this;
        for (auto child : this->topCells)
            child->parent = this;
        this->rules.parent = this;
        for (auto child : this->rules)
            child->parent = this;
        if (this->blockName) this->blockName->parent = this;
    }